

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

tuple<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>,_double>
* __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::to_ising
          (tuple<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>,_double>
           *__return_storage_ptr__,BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this)

{
  double offset;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> bqm;
  double local_130;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> local_b8;
  
  local_128._M_buckets._0_4_ = 0;
  change_vartype(&local_b8,this,(Vartype *)&local_128,false);
  _generate_linear((Linear<unsigned_int,_double> *)&local_128,&local_b8);
  get_quadratic((Quadratic<unsigned_int,_double> *)&local_f0,&local_b8);
  local_130 = local_b8.m_offset;
  std::
  _Tuple_impl<0ul,std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>,double>
  ::
  _Tuple_impl<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>const&,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>const&,double&,void>
            ((_Tuple_impl<0ul,std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>,double>
              *)__return_storage_ptr__,
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)&local_128,
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)&local_f0,&local_130);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128);
  ~BinaryQuadraticModel(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Linear<IndexType, FloatType>, Quadratic<IndexType, FloatType>, FloatType> to_ising() {
      // change vartype to spin
      BinaryQuadraticModel<IndexType, FloatType, DataType> bqm = change_vartype( Vartype::SPIN, false );

      const Linear<IndexType, FloatType> &linear = bqm.get_linear();
      const Quadratic<IndexType, FloatType> &quadratic = bqm.get_quadratic();
      FloatType offset = bqm.get_offset();
      return std::make_tuple( linear, quadratic, offset );
    }